

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_convert_tile_tdouble
              (fitsfile *outfptr,long row,void *tiledata,long tilelen,long tilenx,long tileny,
              int nullcheck,void *nullflagval,int nullval,int zbitpix,double scale,double zero,
              int *intlength,int *flag,double *bscale,double *bzero,int *status)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  int *value;
  long lVar4;
  char *err_message;
  long lVar5;
  FITSfile *pFVar6;
  double in_null_value;
  int imaxval;
  int iminval;
  time_t local_38;
  
  iminval = 0;
  imaxval = 0;
  if ((((zero != 0.0) || (NAN(zero))) || (scale != 1.0)) ||
     ((NAN(scale) || (zbitpix != 0x20 && (zbitpix & 0xffffffdfU) != 0xffffffc0)))) {
    err_message = "Implicit datatype conversion is not supported when writing to compressed images";
LAB_001be148:
    ffpmsg(err_message);
    *status = 0x19d;
    return 0x19d;
  }
  *intlength = 4;
  pFVar6 = outfptr->Fptr;
  if (pFVar6->cn_zscale < 1) {
    if ((pFVar6->quantize_level != 9999.0) || (NAN(pFVar6->quantize_level))) {
      imcomp_nulldoubles((double *)tiledata,tilelen,(int *)tiledata,nullcheck,*nullflagval,nullval,
                         status);
    }
    else if (nullcheck == 1) {
      imcomp_double2nan((double *)tiledata,tilelen,(LONGLONG *)tiledata,*nullflagval,status);
    }
    goto LAB_001be347;
  }
  if (nullcheck == 1) {
    in_null_value = *nullflagval;
  }
  else {
    in_null_value = -9.1191291391491e-36;
  }
  if (pFVar6->quantize_method - 1U < 2) {
    if (pFVar6->request_dither_seed == 0) {
      if (pFVar6->dither_seed == 0) {
        local_38 = time((time_t *)0x0);
        uVar3 = clock();
        pFVar6 = outfptr->Fptr;
        pFVar6->dither_seed =
             ((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / 10000)
              + (int)local_38 + pFVar6->curhdu) % 10000 + 1;
        value = &pFVar6->dither_seed;
        goto LAB_001be2ce;
      }
    }
    else if ((pFVar6->request_dither_seed < 0) && (pFVar6->dither_seed < 0)) {
      value = &pFVar6->dither_seed;
      lVar4 = 0;
      lVar5 = tilelen << 3;
      if (tilelen << 3 < 1) {
        lVar5 = lVar4;
      }
      uVar3 = 0;
      for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
        uVar3 = uVar3 + *(byte *)((long)tiledata + lVar4);
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      *value = SUB164(auVar1 % ZEXT816(10000),0) + 1;
LAB_001be2ce:
      ffuky(outfptr,0x1f,"ZDITHER0",value,(char *)0x0,status);
    }
    pFVar6 = outfptr->Fptr;
    lVar5 = pFVar6->dither_seed + row + -1;
    iVar2 = pFVar6->quantize_method;
  }
  else {
    if (pFVar6->quantize_method != -1) {
      ffpmsg("Unknown subtractive dithering method.");
      err_message = "May need to install a newer version of CFITSIO.";
      goto LAB_001be148;
    }
    lVar5 = 0;
    iVar2 = -1;
  }
  iVar2 = fits_quantize_double
                    (lVar5,(double *)tiledata,tilenx,tileny,nullcheck,in_null_value,
                     pFVar6->quantize_level,iVar2,(int *)tiledata,bscale,bzero,&iminval,&imaxval);
  *flag = iVar2;
  if (1 < iVar2) {
    *status = iVar2;
    return iVar2;
  }
LAB_001be347:
  return *status;
}

Assistant:

int imcomp_convert_tile_tdouble(
    fitsfile *outfptr,
    long row,
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *flag,
    double *bscale,
    double *bzero,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input double tile array in place to 4-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int *idata;
    long irow, ii;
    double doublenull;
    unsigned char *usbbuff;
    unsigned long dithersum;
    int iminval = 0, imaxval = 0;  /* min and max quantized integers */

        /* datatype of input array is double.  We only support writing this datatype
           to a FITS image with BITPIX = -64 or -32, except we also support the special case where
	   BITPIX = 32 and BZERO = 0 and BSCALE = 1.  */

       if ((zbitpix != LONG_IMG && zbitpix != DOUBLE_IMG && zbitpix != FLOAT_IMG) || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

           *intlength = 4;
           idata = (int *) tiledata;

          /* if the tile-compressed table contains zscale and zzero columns */
          /* then scale and quantize the input floating point data.    */
          /* Otherwise, just truncate the floats to integers.          */

          if ((outfptr->Fptr)->cn_zscale > 0)
          {
            if (nullcheck == 1)
	      doublenull = *(double *) (nullflagval);
	    else
	      doublenull = DOUBLENULLVALUE;

            /* quantize the double values into integers */
              if ((outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_1 ||
	          (outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_2) {

	          /* see if the dithering offset value needs to be initialized (see above) */                  
	          if ((outfptr->Fptr)->request_dither_seed == 0 && (outfptr->Fptr)->dither_seed == 0) {

		     (outfptr->Fptr)->dither_seed = 
		       (( (int)time(NULL) + ( (int) clock() / (int) (CLOCKS_PER_SEC / 100)) + (outfptr->Fptr)->curhdu) % 10000) + 1;
		     
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);

	          } else if ((outfptr->Fptr)->request_dither_seed < 0 && (outfptr->Fptr)->dither_seed < 0) {

		     usbbuff = (unsigned char *) tiledata;
		     dithersum = 0;
		     for (ii = 0; ii < 8 * tilelen; ii++) {
		         dithersum += usbbuff[ii];
	             }
		     (outfptr->Fptr)->dither_seed = ((int) (dithersum % 10000)) + 1;
		
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);
		  }

	          irow = row + (outfptr->Fptr)->dither_seed - 1; /* dither the quantized values */

	      } else if ((outfptr->Fptr)->quantize_method == -1) {
	          irow = 0;  /* do not dither the quantized values */
              } else {
                  ffpmsg("Unknown subtractive dithering method.");
                  ffpmsg("May need to install a newer version of CFITSIO.");
                  return(*status = DATA_COMPRESSION_ERR);
              }

            *flag = fits_quantize_double (irow, (double *) tiledata, tilenx, tileny,
               nullcheck, doublenull, (outfptr->Fptr)->quantize_level, 
	       (outfptr->Fptr)->quantize_method, idata,
               bscale, bzero, &iminval, &imaxval);

            if (*flag > 1)
		return(*status = *flag);
          }
          else if ((outfptr->Fptr)->quantize_level != NO_QUANTIZE)
	  {
	    /* if floating point pixels are not being losslessly compressed, then */
	    /* input float data is implicitly converted (truncated) to integers */
             if ((scale != 1. || zero != 0.))  /* must scale the values */
	       imcomp_nullscaledoubles((double *) tiledata, tilelen, idata, scale, zero,
	           nullcheck, *(double *) (nullflagval), nullval, status);
             else
	       imcomp_nulldoubles((double *) tiledata, tilelen, idata,
	           nullcheck, *(double *) (nullflagval), nullval,  status);
          }
          else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE)
	  {
	      /* just convert null values to NaNs in place, if necessary, then do lossless gzip compression */
		if (nullcheck == 1) {
	            imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	                *(double *) (nullflagval), status);
		}
          }
 
          return(*status);
}